

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocketengine.cpp
# Opt level: O0

void __thiscall QSocketEngineHandler::~QSocketEngineHandler(QSocketEngineHandler *this)

{
  long lVar1;
  Type *pTVar2;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->m_mutex = (QMutex *)&PTR__QSocketEngineHandler_0049be90;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::
           operator()(in_stack_ffffffffffffffc8);
  if (pTVar2 != (Type *)0x0) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::operator()
              (in_stack_ffffffffffffffc8);
    QMutexLocker<QMutex>::QMutexLocker(in_RDI,(QMutex *)in_stack_ffffffffffffffc8);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::operator()
              (in_stack_ffffffffffffffc8);
    QList<QSocketEngineHandler*>::removeAll<QSocketEngineHandler*>
              ((QList<QSocketEngineHandler_*> *)in_RDI,
               (QSocketEngineHandler **)in_stack_ffffffffffffffc8);
    QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSocketEngineHandler::~QSocketEngineHandler()
{
    if (!socketHandlers())
        return;
    QMutexLocker locker(&socketHandlers()->mutex);
    socketHandlers()->removeAll(this);
}